

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O1

Name wasm::Names::
     getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
               (Name root,
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               *existingNames)

{
  ulong uVar1;
  string *in_R9;
  Name root_00;
  IString IVar2;
  long *local_68 [2];
  long local_58 [2];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  root_00.super_IString.str._M_len = root.super_IString.str._M_str;
  uStack_40 = 0;
  pcStack_30 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:129:5)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:129:5)>
             ::_M_manager;
  uVar1 = (existingNames->_M_h)._M_element_count;
  local_68[0] = local_58;
  local_48 = existingNames;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"_","");
  root_00.super_IString.str._M_str = (char *)&local_48;
  IVar2.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)(uVar1 & 0xffffffff),(Index)local_68,in_R9
                          );
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (IString)(IString)IVar2.str;
}

Assistant:

inline Name getValidNameGivenExisting(Name root, const T& existingNames) {
  return getValidName(
    root,
    [&](Name test) { return !existingNames.count(test); },
    existingNames.size());
}